

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

void __thiscall cmDependsFortran::cmDependsFortran(cmDependsFortran *this,cmLocalGenerator *lg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmDependsFortranInternals *pcVar3;
  char *__s;
  size_t sVar4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  pointer pbVar7;
  string def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  definitions;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  cmDependsFortran *local_78;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50 [2];
  long local_40 [2];
  
  cmDepends::cmDepends(&this->super_cmDepends,lg,"");
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_006d75c8;
  local_80 = &(this->SourceFile).field_2;
  (this->SourceFile)._M_dataplus._M_p = (pointer)local_80;
  (this->SourceFile)._M_string_length = 0;
  (this->SourceFile).field_2._M_local_buf[0] = '\0';
  local_70 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->PPDefinitions;
  p_Var6 = &(this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = this;
  pcVar3 = (cmDependsFortranInternals *)operator_new(0x90);
  p_Var6 = &(pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header
  ;
  (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = &(pcVar3->TargetRequires)._M_t._M_impl.super__Rb_tree_header;
  (pcVar3->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pcVar3->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pcVar3->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header
  ;
  (pcVar3->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (pcVar3->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = &(pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
  (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Internal = pcVar3;
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Fortran","");
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"CMAKE_TARGET_DEFINITIONS_Fortran","");
  __s = cmMakefile::GetDefinition(this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (__s != (char *)0x0) {
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,__s,__s + sVar4);
    cmSystemTools::ExpandListArgument(&local_a0,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar2,pcVar2 + pbVar7->_M_string_length);
      lVar5 = std::__cxx11::string::find((char *)&local_a0,0x5cc547,0);
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)pbVar7);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(local_70,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

cmDependsFortran
::cmDependsFortran(cmLocalGenerator* lg):
  cmDepends(lg),
  Internal(new cmDependsFortranInternals)
{
  // Configure the include file search path.
  this->SetIncludePathFromLanguage("Fortran");

  // Get the list of definitions.
  std::vector<std::string> definitions;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  if(const char* c_defines =
     mf->GetDefinition("CMAKE_TARGET_DEFINITIONS_Fortran"))
    {
    cmSystemTools::ExpandListArgument(c_defines, definitions);
    }

  // translate i.e. FOO=BAR to FOO and add it to the list of defined
  // preprocessor symbols
  for(std::vector<std::string>::const_iterator
      it = definitions.begin(); it != definitions.end(); ++it)
    {
    std::string def = *it;
    std::string::size_type assignment = def.find("=");
    if(assignment != std::string::npos)
      {
      def = it->substr(0, assignment);
      }
    this->PPDefinitions.insert(def);
    }
}